

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O1

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *algc,ItemNamer *vnam)

{
  double value;
  Buffer<char> *pBVar1;
  ulong uVar2;
  double value_00;
  FormatSpec local_48;
  
  value = (algc->super_AlgConRange).lb_;
  value_00 = (algc->super_AlgConRange).ub_;
  if ((-1.79769313486232e+308 < value) && (value < value_00)) {
    local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
    local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
    local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
    local_48.flags_ = 0;
    local_48.precision_ = -1;
    local_48.type_ = '\0';
    fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value,&local_48);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar2 = pBVar1->size_ + 4;
    if (pBVar1->capacity_ < uVar2) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
    }
    builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," <= ",4);
    pBVar1->size_ = uVar2;
  }
  WriteModelItem(wrt,&algc->super_LinTerms,vnam);
  if ((value != value_00) || (NAN(value) || NAN(value_00))) {
    if (1.79769313486232e+308 <= value_00) {
      return;
    }
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar2 = pBVar1->size_ + 4;
    if (pBVar1->capacity_ < uVar2) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
    }
    builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," <= ",4);
    pBVar1->size_ = uVar2;
  }
  else {
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar2 = pBVar1->size_ + 4;
    if (pBVar1->capacity_ < uVar2) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
    }
    builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," == ",4);
    pBVar1->size_ = uVar2;
    value_00 = value;
  }
  local_48.type_ = '\0';
  local_48.precision_ = -1;
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value_00,&local_48);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const AlgebraicConstraint<Body, AlgConRange>& algc,
                    ItemNamer& vnam) {
  const auto& rng = algc.GetRhsOrRange();
  if (rng.lb() > -DBL_MAX && rng.lb() < rng.ub())
    wrt << rng.lb() << " <= ";
  WriteModelItem(wrt, algc.GetBody(), vnam);
  if (rng.lb() == rng.ub())
    wrt << " == " << rng.lb();
  else if (rng.ub() < DBL_MAX)
    wrt << " <= " << rng.ub();
}